

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScanSSA.h
# Opt level: O3

Interval * __thiscall Interval::split(Interval *__return_storage_ptr__,Interval *this,int position)

{
  pointer *pppVar1;
  pointer ppVar2;
  int iVar3;
  iterator __position;
  pointer ppVar4;
  pair<int,_int> pair1;
  pair<int,_int> local_28;
  
  if (this->_fixed == true) {
    __assert_fail("!isFixed() && \"Fixed interval is not splittable\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zhuez16[P]bazinga_compiler/include/codegen/LinearScanSSA.h"
                  ,0x61,"Interval Interval::split(int)");
  }
  Interval(__return_storage_ptr__);
  ppVar4 = (this->_intervals).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  ppVar2 = (this->_intervals).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar4 == ppVar2) goto LAB_001571fc;
    iVar3 = ppVar4->first;
    if ((iVar3 <= position) && (iVar3 != ppVar4->second && position <= ppVar4->second)) break;
    ppVar4 = ppVar4 + 1;
  }
  __position._M_current = ppVar2 + -1;
  if (ppVar2[-1].first != iVar3) {
    do {
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::insert
                (&__return_storage_ptr__->_intervals,
                 (__return_storage_ptr__->_intervals).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,__position._M_current);
      ppVar2 = (this->_intervals).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      (this->_intervals).
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish = ppVar2 + -1;
      iVar3 = ppVar2[-2].first;
      __position._M_current = ppVar2 + -2;
    } while (iVar3 != ppVar4->first);
  }
  local_28.second = position + -1;
  local_28.first = iVar3;
  (this->_intervals).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = __position._M_current;
  if (__position._M_current ==
      (this->_intervals).
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    _M_realloc_insert<std::pair<int,int>const&>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)this,__position,
               &local_28);
  }
  else {
    *__position._M_current = local_28;
    pppVar1 = &(this->_intervals).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  addRange(__return_storage_ptr__,position,this->_end);
  this->_end = position + -1;
LAB_001571fc:
  __return_storage_ptr__->_v = this->_v;
  return __return_storage_ptr__;
}

Assistant:

Interval split(int position){
        assert(!isFixed() && "Fixed interval is not splittable");
        // if (position < 0) assert(0);
        // setSpill(position);
        Interval P1;
        for (auto it = _intervals.begin(); it != _intervals.end(); ++it){
            if (it->first <= position && it->second >= position && it->first!=it->second){
//                addRange(it->first,position-1);
//                addRange(position,it->second);
                while (_intervals.back().first != it->first){
                    P1._intervals.insert(P1._intervals.begin(),_intervals.back());
                    _intervals.pop_back();
                }
                auto pair1=std::make_pair(it->first,position-1);
                _intervals.pop_back();
                _intervals.push_back(pair1);
                P1.addRange(position,this->_end);
                this->_end=position-1;
                break;
            }
        }
        P1.setValue(getValue());
        // P1._begin=position;
//        while (this->_intervals.back().first >= position) this->_intervals.pop_back();
//        this->_end=position-1;
//        P1.setValue(getValue());
//        P1.setRegister(-1);
//        P1.setSpill(-1);
        return P1;
    }